

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O3

void __thiscall LexicalAnalyzer::endVariable(LexicalAnalyzer *this,string *str)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  pointer pbVar4;
  undefined1 *puVar5;
  bool bVar6;
  string temp;
  undefined1 *local_a0;
  size_t local_98;
  undefined1 local_90 [16];
  string *local_80;
  pointer local_78;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_80 = &this->variable;
  do {
    pbVar4 = (this->vStrSignsNotFirst).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_78 = (this->vStrSignsNotFirst).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 != local_78) {
      do {
        pcVar1 = (pbVar4->_M_dataplus)._M_p;
        local_a0 = local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar1,pcVar1 + pbVar4->_M_string_length);
        std::__cxx11::string::substr((ulong)&local_70,(ulong)str);
        puVar5 = local_70;
        if ((local_98 != local_68) ||
           ((bVar6 = true, local_98 != 0 && (iVar3 = bcmp(local_a0,local_70,local_98), iVar3 != 0)))
           ) {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
          puVar2 = local_50;
          if (local_98 == local_48) {
            if (local_98 == 0) {
              bVar6 = true;
            }
            else {
              iVar3 = bcmp(local_a0,local_50,local_98);
              bVar6 = iVar3 == 0;
            }
          }
          else {
            bVar6 = false;
          }
          puVar5 = local_70;
          if (puVar2 != local_40) {
            operator_delete(puVar2);
            puVar5 = local_70;
          }
        }
        if (puVar5 != local_60) {
          operator_delete(puVar5);
        }
        if (local_a0 != local_90) {
          operator_delete(local_a0);
        }
        if (bVar6) {
          return;
        }
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != local_78);
    }
    std::__cxx11::string::push_back((char)local_80);
    this->index = this->index + 1;
  } while( true );
}

Assistant:

void LexicalAnalyzer::endVariable(string str){
    while(true){
        for(string temp : vStrSignsNotFirst){
            if((temp == str.substr(index,2) || (temp == str.substr(index,1))))
                return;
        }
        variable += str[index];
        index++;
    }
}